

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier
          (GED_BasicGroundCombatSoldier *this)

{
  char local_1d;
  KINT8 i;
  GED_BasicGroundCombatSoldier *this_local;
  
  GED::GED(&this->super_GED);
  (this->super_GED).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GED_BasicGroundCombatSoldier_003317f8;
  this->m_ui16EntityID = 0;
  DATA_TYPE::EntityAppearance::EntityAppearance(&this->m_EA);
  this->m_i8Spd = '\0';
  this->m_i8HdAz = '\0';
  this->m_i8HdElv = '\0';
  this->m_i8HdScanRt = '\0';
  this->m_i8HdElvRt = '\0';
  for (local_1d = '\0'; local_1d < '\x03'; local_1d = local_1d + '\x01') {
    this->m_i16Offsets[local_1d] = 0;
    this->m_i8Ori[local_1d] = '\0';
  }
  return;
}

Assistant:

GED_BasicGroundCombatSoldier::GED_BasicGroundCombatSoldier() :
    m_ui16EntityID( 0 ),
    m_i8Spd( 0 ),
    m_i8HdAz( 0 ),
    m_i8HdElv( 0 ),
    m_i8HdScanRt( 0 ),
    m_i8HdElvRt( 0 )
{
    for( KINT8 i = 0; i < 3; ++i )
    {
        m_i16Offsets[i] = 0;
        m_i8Ori[i] = 0;
    }
}